

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.hh
# Opt level: O0

edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
* __thiscall
tchecker::graph::directed::
edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
::operator++(edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
             *this)

{
  bool bVar1;
  make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  *p;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  local_18;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
  *local_10;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
  *this_local;
  
  local_10 = this;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            (&local_18,
             (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
              *)0x0);
  bVar1 = tchecker::operator!=(&this->_edge,&local_18);
  if (!bVar1) {
    __assert_fail("_edge != EDGE_PTR{nullptr}",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/graph/directed_graph.hh"
                  ,0xea,
                  "tchecker::graph::directed::edge_iterator_t<TAG, EDGE_PTR> &tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming, tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>>>::operator++() [TAG = tchecker::graph::directed::details::incoming, EDGE_PTR = tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>>]"
                 );
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_18);
  pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
           ::operator->(&this->_edge);
  p = edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
      ::next<tchecker::graph::directed::details::incoming>
                (&(pmVar2->
                  super_edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>
                  ).
                  super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
                );
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::operator=(&this->_edge,p);
  return this;
}

Assistant:

tchecker::graph::directed::edge_iterator_t<TAG, EDGE_PTR> & operator++()
  {
    assert(_edge != EDGE_PTR{nullptr});
    _edge = _edge->template next<TAG>();
    return *this;
  }